

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixSegment.hpp
# Opt level: O0

void __thiscall
cppjieba::MixSegment::MixSegment(MixSegment *this,DictTrie *dictTrie,HMMModel *model)

{
  HMMModel *model_local;
  DictTrie *dictTrie_local;
  MixSegment *this_local;
  
  SegmentTagged::SegmentTagged(&this->super_SegmentTagged);
  (this->super_SegmentTagged).super_SegmentBase._vptr_SegmentBase =
       (_func_int **)&PTR__MixSegment_0013ece8;
  MPSegment::MPSegment(&this->mpSeg_,dictTrie);
  HMMSegment::HMMSegment(&this->hmmSeg_,model);
  PosTagger::PosTagger((PosTagger *)&this->field_0xe0);
  return;
}

Assistant:

MixSegment(const DictTrie* dictTrie, const HMMModel* model) 
    : mpSeg_(dictTrie), hmmSeg_(model) {
  }